

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O2

void frssort(string *strings,size_t scnt)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  group pgVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  list_conflict __ptr;
  group_conflict g;
  group pgVar9;
  list_conflict plVar10;
  undefined8 *puVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  list plVar17;
  undefined8 *puVar18;
  list_conflict plVar19;
  char cVar20;
  uint local_89c;
  uint local_848 [256];
  uint local_448;
  character used1 [257];
  
  __ptr = (list_conflict)calloc(scnt,0x18);
  plVar10 = __ptr;
  for (uVar15 = 0; scnt != uVar15; uVar15 = uVar15 + 1) {
    plVar19 = (list_conflict)0x0;
    if (uVar15 < scnt - 1) {
      plVar19 = plVar10 + 1;
    }
    plVar10->str = strings[uVar15];
    plVar10->next = plVar19;
    plVar10 = plVar10 + 1;
  }
  plVar17 = __ptr;
  if (1 < (int)scnt) {
    sVar12 = scnt;
    initmem(groupmem,0x30,(int)((scnt & 0xffffffff) / 0xf));
    initmem(bucketmem,0x28,(int)((scnt & 0xffffffff) / 5));
    g = (group_conflict)allocmem(groupmem,0x30);
    pgVar9 = (group)allocmem(groupmem,0x30);
    g->nextunf = pgVar9;
    g->next = pgVar9;
    pgVar9->head = __ptr;
    pgVar9->finis = 0;
    pgVar9->next = (group)0x0;
    pgVar9->nextunf = (group)0x0;
    intobuckets(g,(bucket_conflict *)used1,(int *)local_848,(int *)0x0,(int)sVar12);
    local_89c = 0;
    while (g->nextunf != (group)0x0) {
      local_89c = local_89c + 2;
      uVar6 = local_448;
      if ((int)local_448 < 1) {
        uVar6 = 0;
      }
      uVar7 = used1[0x100];
      if (used1[0x100] < 1) {
        uVar7 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar7; uVar15 = uVar15 + 1) {
        iVar1 = used1[uVar15];
        for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
          lVar13 = (long)(int)(local_848[uVar14] | iVar1 << 8);
          puVar18 = *(undefined8 **)(forward2_b + lVar13 * 8);
          if (puVar18 != (undefined8 *)0x0) {
            cVar20 = (char)local_848[uVar14];
            for (; puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)puVar18[4]) {
              if ((cVar20 == '\0') || (0x13 < *(int *)(puVar18 + 2))) {
                plVar10 = (list_conflict)*puVar18;
                uVar16 = (uint)(cVar20 == '\0');
              }
              else {
                plVar10 = (list_conflict)*puVar18;
                if (1 < *(int *)(puVar18 + 2)) {
                  plVar10 = ForListInsertsort(plVar10,(list_conflict *)(puVar18 + 1),local_89c);
                  *puVar18 = plVar10;
                }
                uVar16 = 1;
              }
              lVar2 = puVar18[1];
              plVar3 = (long *)puVar18[3];
              if (*plVar3 == 0) {
                *plVar3 = (long)plVar10;
                plVar3[1] = lVar2;
                *(uint *)(plVar3 + 5) = uVar16;
                plVar3[4] = (long)plVar3;
              }
              else if ((uVar16 == 0) || (lVar4 = plVar3[4], *(int *)(lVar4 + 0x28) == 0)) {
                puVar11 = (undefined8 *)allocmem(groupmem,0x30);
                *puVar11 = plVar10;
                puVar11[1] = lVar2;
                lVar2 = plVar3[4];
                uVar8 = *(undefined8 *)(lVar2 + 0x18);
                puVar11[2] = *(undefined8 *)(lVar2 + 0x10);
                puVar11[3] = uVar8;
                *(uint *)(puVar11 + 5) = uVar16;
                *(undefined8 **)(lVar2 + 0x10) = puVar11;
                *(undefined8 **)(lVar2 + 0x18) = puVar11;
                plVar3[4] = (long)puVar11;
              }
              else {
                *(list_conflict *)(*(long *)(lVar4 + 8) + 8) = plVar10;
                *(long *)(lVar4 + 8) = lVar2;
              }
            }
            *(undefined8 *)(forward2_b + lVar13 * 8) = 0;
          }
        }
      }
      intobuckets(g,(bucket_conflict *)used1,(int *)local_848,(int *)(ulong)local_89c,(int)sVar12);
    }
    plVar17 = g->next->head;
    pgVar9 = g->next;
    while (pgVar5 = pgVar9->next, pgVar5 != (group)0x0) {
      pgVar9->tail->next = pgVar5->head;
      pgVar9 = pgVar5;
    }
    freemem(bucketmem);
    freemem(groupmem);
  }
  for (sVar12 = 0; scnt != sVar12; sVar12 = sVar12 + 1) {
    strings[sVar12] = plVar17->str;
    plVar17 = plVar17->next;
  }
  free(__ptr);
  return;
}

Assistant:

void frssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = forward2(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}